

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseElementEnd(xmlParserCtxtPtr ctxt)

{
  xmlNodePtr node;
  xmlParserNodeInfo *pxVar1;
  xmlParserNodeInfoPtr node_info;
  xmlNodePtr cur;
  xmlParserCtxtPtr ctxt_local;
  
  node = ctxt->node;
  if (ctxt->nameNr < 1) {
    if ((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '/')) {
      ctxt->input->cur = ctxt->input->cur + 2;
      ctxt->input->col = ctxt->input->col + 2;
      if (*ctxt->input->cur == '\0') {
        xmlParserGrow(ctxt);
      }
    }
  }
  else {
    if (ctxt->sax2 == 0) {
      xmlParseEndTag1(ctxt,0);
    }
    else {
      xmlParseEndTag2(ctxt,ctxt->pushTab + (ctxt->nameNr + -1));
      namePop(ctxt);
    }
    if (((node != (xmlNodePtr)0x0) && (ctxt->record_info != 0)) &&
       (pxVar1 = xmlParserFindNodeInfo(ctxt,node), pxVar1 != (xmlParserNodeInfo *)0x0)) {
      pxVar1->end_pos =
           (unsigned_long)(ctxt->input->cur + (ctxt->input->consumed - (long)ctxt->input->base));
      pxVar1->end_line = (long)ctxt->input->line;
    }
  }
  return;
}

Assistant:

static void
xmlParseElementEnd(xmlParserCtxtPtr ctxt) {
    xmlNodePtr cur = ctxt->node;

    if (ctxt->nameNr <= 0) {
        if ((RAW == '<') && (NXT(1) == '/'))
            SKIP(2);
        return;
    }

    /*
     * parse the end of tag: '</' should be here.
     */
    if (ctxt->sax2) {
	xmlParseEndTag2(ctxt, &ctxt->pushTab[ctxt->nameNr - 1]);
	namePop(ctxt);
    }
#ifdef LIBXML_SAX1_ENABLED
    else
	xmlParseEndTag1(ctxt, 0);
#endif /* LIBXML_SAX1_ENABLED */

    /*
     * Capture end position
     */
    if (cur != NULL && ctxt->record_info) {
        xmlParserNodeInfoPtr node_info;

        node_info = (xmlParserNodeInfoPtr) xmlParserFindNodeInfo(ctxt, cur);
        if (node_info != NULL) {
            node_info->end_pos = ctxt->input->consumed +
                                 (CUR_PTR - ctxt->input->base);
            node_info->end_line = ctxt->input->line;
        }
    }
}